

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_configset_set(cali_configset_t cfg,char *key,char *value)

{
  mapped_type *this;
  allocator<char> local_41;
  key_type local_40;
  char *local_20;
  char *value_local;
  char *key_local;
  cali_configset_t cfg_local;
  
  local_20 = value;
  value_local = key;
  key_local = (char *)cfg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,key,&local_41);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[](&cfg->cfgset,&local_40);
  std::__cxx11::string::operator=((string *)this,value);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void cali_configset_set(cali_configset_t cfg, const char* key, const char* value)
{
    cfg->cfgset[key] = value;
}